

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-watcher-cross-stop.c
# Opt level: O1

int run_test_watcher_cross_stop(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 *extraout_RDX;
  long lVar3;
  uv_udp_t *puVar4;
  sockaddr_in addr;
  char big_string [1024];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  rlimit64 local_438 [64];
  
  uVar2 = uv_default_loop();
  local_438[0].rlim_cur = 0x9e4;
  local_438[0].rlim_max = 0x9e4;
  iVar1 = setrlimit64(RLIMIT_NOFILE,local_438);
  if (iVar1 != 0) {
    run_test_watcher_cross_stop_cold_1();
    return 1;
  }
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_448);
  if (iVar1 == 0) {
    memset(local_438,0x41,0x400);
    local_458 = uv_buf_init(local_438,0x400);
    puVar4 = sockets;
    lVar3 = 0;
    do {
      iVar1 = uv_udp_init(uVar2,puVar4);
      if (iVar1 != 0) {
LAB_0018c058:
        run_test_watcher_cross_stop_cold_3();
        goto LAB_0018c05d;
      }
      iVar1 = uv_udp_bind(puVar4,local_448,4);
      if (iVar1 != 0) {
LAB_0018c053:
        run_test_watcher_cross_stop_cold_4();
        goto LAB_0018c058;
      }
      iVar1 = uv_udp_recv_start(puVar4,alloc_cb,recv_cb);
      if (iVar1 != 0) {
LAB_0018c04e:
        run_test_watcher_cross_stop_cold_5();
        goto LAB_0018c053;
      }
      iVar1 = uv_udp_send((long)reqs[0].reserved + lVar3 + -0x10,puVar4,local_458,1,local_448,
                          send_cb);
      if (iVar1 != 0) {
        run_test_watcher_cross_stop_cold_6();
        goto LAB_0018c04e;
      }
      puVar4 = puVar4 + 1;
      lVar3 = lVar3 + 0x140;
    } while (lVar3 != 800000);
    while (recv_cb_called == 0) {
      uv_run(uVar2,1);
    }
    lVar3 = 0;
    do {
      uv_close((long)sockets[0].handle_queue + lVar3 + -0x20,close_cb);
      lVar3 = lVar3 + 0xd8;
    } while (lVar3 != 540000);
    if (recv_cb_called == 0) goto LAB_0018c062;
    uv_run(uVar2,0);
    if (send_cb_called != 0x9c4) goto LAB_0018c067;
    if (close_cb_called == 0x9c4) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0018c071;
    }
  }
  else {
LAB_0018c05d:
    run_test_watcher_cross_stop_cold_2();
LAB_0018c062:
    run_test_watcher_cross_stop_cold_10();
LAB_0018c067:
    run_test_watcher_cross_stop_cold_7();
  }
  run_test_watcher_cross_stop_cold_8();
LAB_0018c071:
  run_test_watcher_cross_stop_cold_9();
  *extraout_RDX = slab;
  extraout_RDX[1] = 1;
  return 0x7286fc;
}

Assistant:

TEST_IMPL(watcher_cross_stop) {
#if defined(__MVS__)
  RETURN_SKIP("zOS does not allow address or port reuse when using UDP sockets");
#endif
  uv_loop_t* loop = uv_default_loop();
  unsigned int i;
  struct sockaddr_in addr;
  uv_buf_t buf;
  char big_string[1024];

  TEST_FILE_LIMIT(ARRAY_SIZE(sockets) + 32);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  memset(big_string, 'A', sizeof(big_string));
  buf = uv_buf_init(big_string, sizeof(big_string));

  for (i = 0; i < ARRAY_SIZE(sockets); i++) {
    ASSERT(0 == uv_udp_init(loop, &sockets[i]));
    ASSERT(0 == uv_udp_bind(&sockets[i],
                            (const struct sockaddr*) &addr,
                            UV_UDP_REUSEADDR));
    ASSERT(0 == uv_udp_recv_start(&sockets[i], alloc_cb, recv_cb));
    ASSERT(0 == uv_udp_send(&reqs[i],
                            &sockets[i],
                            &buf,
                            1,
                            (const struct sockaddr*) &addr,
                            send_cb));
  }

  while (recv_cb_called == 0)
    uv_run(loop, UV_RUN_ONCE);

  for (i = 0; i < ARRAY_SIZE(sockets); i++)
    uv_close((uv_handle_t*) &sockets[i], close_cb);

  ASSERT(recv_cb_called > 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(ARRAY_SIZE(sockets) == send_cb_called);
  ASSERT(ARRAY_SIZE(sockets) == close_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}